

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fiorso_getgame(char *saved_file,char *fnamebuf,size_t buflen)

{
  FILE *__stream;
  size_t sVar1;
  int iVar2;
  ulong __size;
  undefined1 auVar3 [16];
  char buf [18];
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  ushort local_28;
  
  __stream = fopen(saved_file,"rb");
  if (__stream == (FILE *)0x0) {
    iVar2 = 0;
  }
  else {
    sVar1 = fread(&local_38,0x12,1,__stream);
    iVar2 = 0;
    if ((sVar1 == 1) &&
       (auVar3[0] = -(local_38 == 'T'), auVar3[1] = -(cStack_37 == 'A'),
       auVar3[2] = -(cStack_36 == 'D'), auVar3[3] = -(cStack_35 == 'S'),
       auVar3[4] = -(cStack_34 == '2'), auVar3[5] = -(cStack_33 == ' '),
       auVar3[6] = -(cStack_32 == 's'), auVar3[7] = -(cStack_31 == 'a'),
       auVar3[8] = -(cStack_30 == 'v'), auVar3[9] = -(cStack_2f == 'e'),
       auVar3[10] = -(cStack_2e == '/'), auVar3[0xb] = -(cStack_2d == 'g'),
       auVar3[0xc] = -(cStack_2c == '\n'), auVar3[0xd] = -(cStack_2b == '\r'),
       auVar3[0xe] = -(cStack_2a == '\x1a'), auVar3[0xf] = -(cStack_29 == '\0'), iVar2 = 0,
       (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
       == 0xffff)) {
      __size = buflen - 1;
      if ((ulong)local_28 <= buflen - 1) {
        __size = (ulong)local_28;
      }
      sVar1 = fread(fnamebuf,__size,1,__stream);
      if (sVar1 == 1) {
        fnamebuf[__size] = '\0';
        iVar2 = 1;
      }
    }
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

int fiorso_getgame(char *saved_file, char *fnamebuf, size_t buflen)
{
    osfildef *fp;
    uint      namelen;
    char      buf[sizeof(FIOSAVHDR_PREFIX) + 2];

    /* open the input file */
    if (!(fp = osfoprb(saved_file, OSFTSAVE)))
        return FALSE;

    /* read the prefix header and check */
    if (osfrb(fp, buf, (int)(sizeof(FIOSAVHDR_PREFIX) + 2))
        || memcmp(buf, FIOSAVHDR_PREFIX, sizeof(FIOSAVHDR_PREFIX)) != 0)
    {
        /* 
         *   there's no game file information - close the file and
         *   indicate that we have no information 
         */
        osfcls(fp);
        return FALSE;
    }

    /* get the length of the filename */
    namelen = osrp2(buf + sizeof(FIOSAVHDR_PREFIX));
    if (namelen > buflen - 1)
        namelen = buflen - 1;

    /* read the filename */
    if (osfrb(fp, fnamebuf, namelen))
    {
        osfcls(fp);
        return FALSE;
    }

    /* null-terminate the string */
    fnamebuf[namelen] = '\0';

    /* done with the file */
    osfcls(fp);

    /* indicate that we found the information */
    return TRUE;
}